

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall simple_json::Stream::end_json_array(Stream *this)

{
  bool bVar1;
  reference pvVar2;
  CompilerError *this_00;
  allocator local_31;
  string local_30 [32];
  Stream *local_10;
  Stream *this_local;
  
  local_10 = this;
  bVar1 = std::
          stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
          ::empty(&this->stack);
  if (!bVar1) {
    pvVar2 = std::
             stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
             ::top(&this->stack);
    if (pvVar2->first == Array) {
      pvVar2 = std::
               stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
               ::top(&this->stack);
      if ((pvVar2->second & 1U) != 0) {
        statement_inner<char_const(&)[2]>(this,(char (*) [2])0x4d8595);
      }
      this->indent = this->indent - 1;
      statement_no_return<char_const(&)[2]>(this,(char (*) [2])0x4e3676);
      std::
      stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
      ::pop(&this->stack);
      bVar1 = std::
              stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
              ::empty(&this->stack);
      if (!bVar1) {
        pvVar2 = std::
                 stack<std::pair<simple_json::Type,_bool>,_std::deque<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>_>
                 ::top(&this->stack);
        pvVar2->second = true;
      }
      return;
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Invalid JSON state",&local_31);
  spirv_cross::CompilerError::CompilerError(this_00,(string *)local_30);
  __cxa_throw(this_00,&spirv_cross::CompilerError::typeinfo,
              spirv_cross::CompilerError::~CompilerError);
}

Assistant:

void Stream::end_json_array()
{
	if (stack.empty() || stack.top().first != Type::Array)
		SPIRV_CROSS_THROW("Invalid JSON state");
	if (stack.top().second)
	{
		statement_inner("\n");
	}
	--indent;
	statement_no_return("]");
	stack.pop();
	if (!stack.empty())
	{
		stack.top().second = true;
	}
}